

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_path(lyd_node *parent,ly_ctx *ctx,char *path,char *value,uint32_t options,
                   lyd_node **node)

{
  ly_ctx *plVar1;
  ly_ctx *local_60;
  ly_ctx *local_58;
  ly_ctx *local_50;
  ly_ctx *local_48;
  lyd_node **node_local;
  uint32_t options_local;
  char *value_local;
  char *path_local;
  ly_ctx *ctx_local;
  lyd_node *parent_local;
  
  if ((parent == (lyd_node *)0x0) && (ctx == (ly_ctx *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent || ctx",
           "lyd_new_path");
    parent_local._4_4_ = LY_EINVAL;
  }
  else if (path == (char *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","path","lyd_new_path");
    parent_local._4_4_ = LY_EINVAL;
  }
  else if ((*path == '/') || (parent != (lyd_node *)0x0)) {
    if (((options & 4) == 0) || ((options & 8) == 0)) {
      if (parent != (lyd_node *)0x0) {
        if (parent->schema == (lysc_node *)0x0) {
          plVar1 = (ly_ctx *)parent[2].schema;
        }
        else {
          plVar1 = parent->schema->module->ctx;
        }
        if ((plVar1 != (ly_ctx *)0x0) && (ctx != (ly_ctx *)0x0)) {
          if (parent == (lyd_node *)0x0) {
            local_50 = (ly_ctx *)0x0;
          }
          else {
            if (parent->schema == (lysc_node *)0x0) {
              local_48 = (ly_ctx *)parent[2].schema;
            }
            else {
              local_48 = parent->schema->module->ctx;
            }
            local_50 = local_48;
          }
          if (local_50 != ctx) {
            if (parent == (lyd_node *)0x0) {
              local_60 = (ly_ctx *)0x0;
            }
            else {
              if (parent->schema == (lysc_node *)0x0) {
                local_58 = (ly_ctx *)parent[2].schema;
              }
              else {
                local_58 = parent->schema->module->ctx;
              }
              local_60 = local_58;
            }
            ly_log(local_60,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call."
                  );
            return LY_EINVAL;
          }
        }
      }
      parent_local._4_4_ =
           lyd_new_path_(parent,ctx,(lysc_ext_instance *)0x0,path,value,0,LYD_ANYDATA_STRING,options
                         ,node,(lyd_node **)0x0);
    }
    else {
      ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
             "!(options & 0x04) || !(options & 0x08)","lyd_new_path");
      parent_local._4_4_ = LY_EINVAL;
    }
  }
  else {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","(path[0] == \'/\') || parent",
           "lyd_new_path");
    parent_local._4_4_ = LY_EINVAL;
  }
  return parent_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_path(struct lyd_node *parent, const struct ly_ctx *ctx, const char *path, const char *value, uint32_t options,
        struct lyd_node **node)
{
    LY_CHECK_ARG_RET(ctx, parent || ctx, path, (path[0] == '/') || parent,
            !(options & LYD_NEW_VAL_BIN) || !(options & LYD_NEW_VAL_CANON), LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(parent ? LYD_CTX(parent) : NULL, ctx, LY_EINVAL);

    return lyd_new_path_(parent, ctx, NULL, path, value, 0, LYD_ANYDATA_STRING, options, node, NULL);
}